

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

int Dtc_ManCutMergeOne(int *pCut0,int *pCut1,int *pCut)

{
  int iVar1;
  int iVar2;
  int t_2;
  int t_1;
  int t;
  int k;
  int i;
  int *pCut_local;
  int *pCut1_local;
  int *pCut0_local;
  
  for (t_1 = 0; t_1 <= *pCut1; t_1 = t_1 + 1) {
    pCut[t_1] = pCut1[t_1];
  }
  for (t = 1; t <= *pCut0; t = t + 1) {
    for (t_1 = 1; (t_1 <= *pCut1 && (pCut0[t] != pCut1[t_1])); t_1 = t_1 + 1) {
    }
    if (*pCut1 < t_1) {
      if (*pCut == 3) {
        return 0;
      }
      iVar1 = pCut0[t];
      iVar2 = *pCut;
      *pCut = iVar2 + 1;
      pCut[iVar2 + 1] = iVar1;
    }
  }
  if ((*pCut != 2) && (*pCut != 3)) {
    __assert_fail("pCut[0] == 2 || pCut[0] == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0xcb,"int Dtc_ManCutMergeOne(int *, int *, int *)");
  }
  if (pCut[2] < pCut[1]) {
    iVar1 = pCut[1];
    pCut[1] = pCut[2];
    pCut[2] = iVar1;
  }
  if (pCut[2] <= pCut[1]) {
    __assert_fail("pCut[1] < pCut[2]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                  ,0xce,"int Dtc_ManCutMergeOne(int *, int *, int *)");
  }
  if (*pCut != 2) {
    if (pCut[3] < pCut[2]) {
      iVar1 = pCut[2];
      pCut[2] = pCut[3];
      pCut[3] = iVar1;
    }
    if (pCut[2] < pCut[1]) {
      iVar1 = pCut[1];
      pCut[1] = pCut[2];
      pCut[2] = iVar1;
    }
    if (pCut[2] <= pCut[1]) {
      __assert_fail("pCut[1] < pCut[2]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0xd5,"int Dtc_ManCutMergeOne(int *, int *, int *)");
    }
    if (pCut[3] <= pCut[2]) {
      __assert_fail("pCut[2] < pCut[3]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0xd6,"int Dtc_ManCutMergeOne(int *, int *, int *)");
    }
  }
  return 1;
}

Assistant:

int Dtc_ManCutMergeOne( int * pCut0, int * pCut1, int * pCut )
{
    int i, k;
    for ( k = 0; k <= pCut1[0]; k++ )
        pCut[k] = pCut1[k];
    for ( i = 1; i <= pCut0[0]; i++ )
    {
        for ( k = 1; k <= pCut1[0]; k++ )
            if ( pCut0[i] == pCut1[k] )
                break;
        if ( k <= pCut1[0] )
            continue;
        if ( pCut[0] == 3 )
            return 0;
        pCut[1+pCut[0]++] = pCut0[i];
    }
    assert( pCut[0] == 2 || pCut[0] == 3 );
    if ( pCut[1] > pCut[2] )
        ABC_SWAP( int, pCut[1], pCut[2] );
    assert( pCut[1] < pCut[2] );
    if ( pCut[0] == 2 )
        return 1;
    if ( pCut[2] > pCut[3] )
        ABC_SWAP( int, pCut[2], pCut[3] );
    if ( pCut[1] > pCut[2] )
        ABC_SWAP( int, pCut[1], pCut[2] );
    assert( pCut[1] < pCut[2] );
    assert( pCut[2] < pCut[3] );
    return 1;
}